

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImVec2 pos;
  undefined8 uVar1;
  bool bVar2;
  uint in_EDX;
  ImRect *in_RSI;
  char *in_RDI;
  ImGuiID in_R8D;
  ImGuiID in_R9D;
  float fVar3;
  undefined8 in_XMM0_Qa;
  ImVec2 *unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  ImDrawList *in_stack_00000010;
  undefined1 *in_stack_00000018;
  ImVec2 *in_stack_00000028;
  ImGuiID in_stack_00000030;
  float ellipsis_max_x;
  ImRect bullet_bb;
  ImGuiLastItemData last_item_backup;
  bool unsaved_marker_visible;
  bool close_button_visible;
  bool close_button_pressed;
  ImVec2 button_pos;
  float button_sz;
  ImRect text_ellipsis_clip_bb;
  ImRect text_pixel_clip_bb;
  ImVec2 label_size;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 repeat;
  ImGuiMouseButton button;
  ImRect *in_stack_fffffffffffffef0;
  ImVec2 *min;
  undefined8 in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  uint uVar4;
  float in_stack_ffffffffffffff0c;
  ImGuiStyleVar in_stack_ffffffffffffff14;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImRect local_c4;
  undefined1 local_b4 [61];
  byte local_77;
  byte local_76;
  byte local_75;
  ImVec2 local_74;
  float local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  float local_50;
  undefined4 uStack_4c;
  ImVec2 local_48;
  ImGuiContext *local_40;
  byte local_31;
  ImGuiID local_30;
  ImGuiID local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_31 = in_stack_00000008 & 1;
  local_40 = GImGui;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_48 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          in_stack_ffffffffffffff00,
                          SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0),
                          (float)in_stack_fffffffffffffef8);
  if (in_stack_00000010 != (ImDrawList *)0x0) {
    *(undefined1 *)&(in_stack_00000010->CmdBuffer).Size = 0;
  }
  if (in_stack_00000018 != (undefined1 *)0x0) {
    *in_stack_00000018 = 0;
  }
  fVar3 = ImRect::GetWidth(in_RSI);
  if (fVar3 <= 1.0) {
    return;
  }
  ImRect::ImRect(in_stack_fffffffffffffef0,(float)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (float)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                 in_stack_fffffffffffffee0);
  repeat = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  local_68 = local_58;
  uVar1 = local_68;
  local_60 = CONCAT44(uStack_4c,local_50);
  if (in_stack_00000018 != (undefined1 *)0x0) {
    local_68._0_4_ = (float)local_58;
    *in_stack_00000018 = local_50 < (float)local_68 + local_48.x;
  }
  local_6c = local_40->FontSize;
  local_68 = uVar1;
  fVar3 = ImMax<float>((in_RSI->Min).x,
                       (-(float)in_XMM0_Qa + -(float)in_XMM0_Qa + (in_RSI->Max).x) - local_6c);
  ImVec2::ImVec2(&local_74,fVar3,(in_RSI->Min).y);
  local_75 = 0;
  local_76 = 0;
  if (local_30 != 0) {
    if ((local_31 & 1) == 0) {
      in_stack_ffffffffffffff0c = ImRect::GetWidth(in_RSI);
      fVar3 = ImMax<float>(local_6c,(local_40->Style).TabMinWidthForCloseButton);
      if (in_stack_ffffffffffffff0c < fVar3) goto LAB_001b9c9d;
    }
    if ((((local_40->HoveredId == local_2c) || (local_40->HoveredId == local_30)) ||
        (local_40->ActiveId == local_2c)) || (local_40->ActiveId == local_30)) {
      local_76 = 1;
    }
  }
LAB_001b9c9d:
  uVar4 = in_stack_ffffffffffffff08 & 0xffffff;
  if ((in_EDX & 1) != 0) {
    uVar4 = CONCAT13(local_74.x + local_6c <= (in_RSI->Max).x,(int3)in_stack_ffffffffffffff08);
  }
  local_77 = (byte)(uVar4 >> 0x18);
  if ((local_76 & 1) == 0) {
    if (local_77 != 0) {
      ImVec2::ImVec2(&local_dc,local_6c,local_6c);
      min = &local_74;
      local_d4 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           (ImVec2 *)0x1b9dde);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0.0);
      local_cc = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           (ImVec2 *)0x1b9e15);
      ImRect::ImRect(&local_c4,min,&local_cc);
      ImRect::GetCenter((ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      GetColorU32((ImGuiCol)((ulong)min >> 0x20),SUB84(min,0));
      pos.y = in_stack_fffffffffffffee4;
      pos.x = in_stack_fffffffffffffee0;
      RenderBullet((ImDrawList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),pos,0
                  );
    }
  }
  else {
    memcpy(local_b4,&local_40->LastItemData,0x3c);
    PushStyleVar(in_stack_ffffffffffffff14,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,uVar4));
    bVar2 = CloseButton(in_stack_00000030,in_stack_00000028);
    if (bVar2) {
      local_75 = 1;
    }
    PopStyleVar((int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    button = (ImGuiMouseButton)in_stack_fffffffffffffef0;
    memcpy(&local_40->LastItemData,local_b4,0x3c);
    if (((in_EDX & 4) == 0) && (bVar2 = IsMouseClicked(button,(bool)repeat), bVar2)) {
      local_75 = 1;
    }
  }
  if (((local_76 & 1) != 0) || ((local_77 & 1) != 0)) {
    fVar3 = local_6c;
    if ((local_76 & 1) == 0) {
      fVar3 = local_6c * 0.8;
    }
    local_50 = local_50 - fVar3;
    if ((local_77 & 1) == 0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = local_6c * 0.8;
    }
    local_60 = CONCAT44(local_60._4_4_,(float)local_60 - fVar3);
  }
  RenderTextEllipsis(in_stack_00000010,(ImVec2 *)CONCAT71(in_stack_00000009,in_stack_00000008),
                     unaff_retaddr,(float)((ulong)in_XMM0_Qa >> 0x20),(float)in_XMM0_Qa,in_RDI,
                     (char *)in_RSI,(ImVec2 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (in_stack_00000010 != (ImDrawList *)0x0) {
    *(byte *)&(in_stack_00000010->CmdBuffer).Size = local_75 & 1;
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}